

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O3

bool __thiscall
qpdf::Stream::pipeStreamData
          (Stream *this,Pipeline *pipeline,bool *filterp,int encode_flags,
          qpdf_stream_decode_level_e decode_level,bool suppress_warnings,bool will_retry)

{
  element_type *peVar1;
  Buffer *this_00;
  element_type *peVar2;
  element_type *peVar3;
  long offset;
  QPDF *qpdf;
  QPDFObjGen QVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Alloc_hider _Var6;
  Pipeline *pPVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  Members *pMVar12;
  undefined7 extraout_var;
  ulong uVar13;
  undefined4 extraout_var_00;
  Pl_Flate *this_01;
  uchar *puVar14;
  size_t sVar15;
  Members *pMVar16;
  runtime_error *this_02;
  long *plVar17;
  logic_error *this_03;
  size_type *psVar18;
  ContentNormalizer *pCVar19;
  pointer psVar20;
  pointer psVar21;
  undefined7 in_register_00000089;
  byte bVar22;
  QPDFObjectHandle *key;
  ulong uVar23;
  ulong uVar24;
  bool lossy_compression;
  bool specialized_compression;
  Pipeline *pipeline_local;
  uint local_23c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_238;
  Stream *local_230;
  undefined1 local_228 [32];
  value_type local_208;
  Members *local_1f8;
  ulong local_1f0;
  Pl_Count count;
  ContentNormalizer *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> to_delete;
  vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
  filters;
  QPDFObjectHandle local_148;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  QPDFObjGen local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar24 = CONCAT71(in_register_00000089,suppress_warnings) & 0xffffffff;
  pipeline_local = pipeline;
  local_230 = this;
  pMVar12 = stream(this);
  filters.
  super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filters.
  super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filters.
  super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  specialized_compression = false;
  lossy_compression = false;
  if (filterp != (bool *)0x0) {
    *filterp = decode_level != qpdf_dl_none || encode_flags != 0;
  }
  if (decode_level == qpdf_dl_none && encode_flags == 0) {
    uVar13 = 0;
LAB_001fd850:
    if (pipeline_local == (Pipeline *)0x0) {
      if (filterp != (bool *)0x0) {
LAB_001fd957:
        uVar13 = (ulong)*filterp;
      }
LAB_001fd95a:
      cVar9 = (char)uVar13;
      goto LAB_001fe11e;
    }
    uVar23 = uVar13;
    if (filterp != (bool *)0x0) {
LAB_001fd880:
      uVar13 = (ulong)*filterp;
    }
    to_delete.
    super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    to_delete.
    super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    to_delete.
    super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Pipeline *)0x0;
    if ((char)uVar13 == '\0') goto LAB_001fdbeb;
    if ((encode_flags & 1U) != 0) {
      local_228._0_4_ = 1;
      count.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Pl_Flate,std::allocator<Pl_Flate>,char_const(&)[16],Pipeline*&,Pl_Flate::action_e>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&count.super_Pipeline.identifier,
                 (Pl_Flate **)&count,(allocator<Pl_Flate> *)&local_1a8,
                 (char (*) [16])"compress stream",&pipeline_local,(action_e *)local_228);
      _Var6 = count.super_Pipeline.identifier._M_dataplus;
      local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)count.super_Pipeline._vptr_Pipeline;
      _Var5._M_pi = local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      count.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
      count.super_Pipeline.identifier._M_dataplus._M_p = (pointer)0x0;
      local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_p;
      if ((_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi),
         count.super_Pipeline.identifier._M_dataplus._M_p != (pointer)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   count.super_Pipeline.identifier._M_dataplus._M_p);
      }
      local_238 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
                (&to_delete,&local_208);
      pipeline_local = local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    local_23c = (uint)CONCAT71(in_register_00000089,suppress_warnings);
    local_1f0 = uVar23;
    if ((encode_flags & 2U) == 0) {
      local_238 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1b0 = (ContentNormalizer *)0x0;
    }
    else {
      count.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<ContentNormalizer,std::allocator<ContentNormalizer>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&count.super_Pipeline.identifier,
                 (ContentNormalizer **)&count,(allocator<ContentNormalizer> *)local_228);
      local_1b0 = (ContentNormalizer *)count.super_Pipeline._vptr_Pipeline;
      local_228._0_8_ = count.super_Pipeline._vptr_Pipeline;
      count.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
      local_238 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  count.super_Pipeline.identifier._M_dataplus._M_p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Pl_QPDFTokenizer,std::allocator<Pl_QPDFTokenizer>,char_const(&)[11],ContentNormalizer*,Pipeline*&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&count.super_Pipeline.identifier,
                 (Pl_QPDFTokenizer **)&count,(allocator<Pl_QPDFTokenizer> *)&local_1a8,
                 (char (*) [11])"normalizer",(ContentNormalizer **)local_228,&pipeline_local);
      _Var6 = count.super_Pipeline.identifier._M_dataplus;
      local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)count.super_Pipeline._vptr_Pipeline;
      _Var5._M_pi = local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      count.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
      count.super_Pipeline.identifier._M_dataplus._M_p = (pointer)0x0;
      local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_p;
      if ((_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi),
         count.super_Pipeline.identifier._M_dataplus._M_p != (pointer)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   count.super_Pipeline.identifier._M_dataplus._M_p);
      }
      std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
                (&to_delete,&local_208);
      pipeline_local = local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    psVar21 = (pMVar12->token_filters).
              super__Vector_base<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_1f8 = pMVar12;
    if (psVar21 !=
        (pMVar12->token_filters).
        super__Vector_base<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        local_228._0_8_ =
             psVar21[-1].
             super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        count.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Pl_QPDFTokenizer,std::allocator<Pl_QPDFTokenizer>,char_const(&)[13],QPDFObjectHandle::TokenFilter*,Pipeline*&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&count.super_Pipeline.identifier,
                   (Pl_QPDFTokenizer **)&count,(allocator<Pl_QPDFTokenizer> *)&local_1a8,
                   (char (*) [13])"token filter",(TokenFilter **)local_228,&pipeline_local);
        _Var6 = count.super_Pipeline.identifier._M_dataplus;
        local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)count.super_Pipeline._vptr_Pipeline;
        _Var5._M_pi = local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi;
        count.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
        count.super_Pipeline.identifier._M_dataplus._M_p = (pointer)0x0;
        local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_p;
        if ((_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi),
           count.super_Pipeline.identifier._M_dataplus._M_p != (pointer)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     count.super_Pipeline.identifier._M_dataplus._M_p);
        }
        std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::
        push_back(&to_delete,&local_208);
        psVar21 = psVar21 + -1;
        pipeline_local = local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      } while (psVar21 !=
               (local_1f8->token_filters).
               super__Vector_base<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    }
    if (filters.
        super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        filters.
        super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      psVar20 = filters.
                super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        peVar1 = psVar20[-1].super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        iVar10 = (*peVar1->_vptr_QPDFStreamFilter[3])(peVar1,pipeline_local);
        pPVar7 = (Pipeline *)CONCAT44(extraout_var_00,iVar10);
        if ((((Pipeline *)CONCAT44(extraout_var_00,iVar10) != (Pipeline *)0x0) ||
            (pPVar7 = pipeline_local, pipeline_local != (Pipeline *)0x0)) &&
           (pipeline_local = pPVar7,
           this_01 = (Pl_Flate *)
                     __dynamic_cast(pipeline_local,&Pipeline::typeinfo,&Pl_Flate::typeinfo,0),
           this_01 != (Pl_Flate *)0x0)) {
          local_138._8_8_ = 0;
          local_138._M_unused._M_object = local_230;
          local_120 = std::
                      _Function_handler<void_(const_char_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_Stream.cc:483:40)>
                      ::_M_invoke;
          local_128 = std::
                      _Function_handler<void_(const_char_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_Stream.cc:483:40)>
                      ::_M_manager;
          Pl_Flate::setWarnCallback(this_01,(function<void_(const_char_*,_int)> *)&local_138);
          if (local_128 != (code *)0x0) {
            (*local_128)(&local_138,&local_138,__destroy_functor);
          }
        }
        psVar20 = psVar20 + -1;
      } while (psVar20 !=
               filters.
               super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    }
    uVar24 = (ulong)local_23c;
    pMVar12 = local_1f8;
    uVar23 = local_1f0;
  }
  else {
    bVar8 = filterable(local_230,&filters,&specialized_compression,&lossy_compression);
    uVar23 = CONCAT71(extraout_var,bVar8) & 0xffffffff;
    if (filterp != (bool *)0x0) {
      *filterp = SUB81(uVar23,0);
      uVar23 = CONCAT71((int7)(uVar23 >> 8),1);
    }
    uVar13 = uVar23;
    if (2 < (int)decode_level) goto LAB_001fd850;
    uVar13 = 0;
    if (lossy_compression == false) {
      uVar13 = uVar23 & 0xff;
    }
    if (lossy_compression == true && filterp != (bool *)0x0) {
      *filterp = false;
      uVar13 = uVar23;
    }
    if ((decode_level == qpdf_dl_specialized) || (specialized_compression != true))
    goto LAB_001fd850;
    if (filterp != (bool *)0x0) {
      *filterp = false;
      uVar23 = uVar13;
      if (pipeline_local == (Pipeline *)0x0) goto LAB_001fd957;
      goto LAB_001fd880;
    }
    if (pipeline_local == (Pipeline *)0x0) {
      uVar13 = 0;
      goto LAB_001fd95a;
    }
    uVar23 = 0;
LAB_001fdbeb:
    to_delete.
    super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    to_delete.
    super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    to_delete.
    super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Pipeline *)0x0;
    local_238 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1b0 = (ContentNormalizer *)0x0;
  }
  pPVar7 = pipeline_local;
  this_00 = (pMVar12->stream_data).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (Buffer *)0x0) {
    if ((pMVar12->stream_provider).
        super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      Pl_Count::Pl_Count(&count,"stream provider count",pipeline_local);
      bVar8 = QPDFObjectHandle::StreamDataProvider::supportsRetry
                        ((pMVar12->stream_provider).
                         super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      peVar2 = (pMVar12->stream_provider).
               super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (bVar8) {
        local_228._0_8_ =
             ((local_230->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og;
        iVar10 = (*peVar2->_vptr_StreamDataProvider[3])
                           (peVar2,local_228,&count,uVar24 & 0xff,(ulong)will_retry);
        cVar9 = (char)iVar10;
        uVar11 = 0;
        if (cVar9 != '\0') {
          uVar11 = (uint)uVar23 & 0xff;
        }
        if (filterp == (bool *)0x0 || cVar9 != '\0') {
          uVar23 = (ulong)uVar11;
        }
        else {
          *filterp = false;
          cVar9 = '\0';
        }
      }
      else {
        local_228._0_8_ =
             ((local_230->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og;
        (*peVar2->_vptr_StreamDataProvider[2])(peVar2,local_228,&count);
        cVar9 = '\x01';
      }
      pMVar16 = (Members *)Pl_Count::getCount(&count);
      local_1f0 = uVar23;
      if (cVar9 != '\0') {
        local_228._0_8_ = local_228 + 0x10;
        local_1f8 = pMVar16;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"/Length","");
        key = &pMVar12->stream_dict;
        bVar8 = QPDFObjectHandle::hasKey(key,(string *)local_228);
        QVar4 = (QPDFObjGen)(local_228 + 0x10);
        if ((QPDFObjGen)local_228._0_8_ != QVar4) {
          operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
        }
        local_228._0_8_ = QVar4;
        if (bVar8) {
          std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"/Length","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_1a8,(string *)key);
          pMVar12 = (Members *)QPDFObjectHandle::getIntValue((QPDFObjectHandle *)&local_1a8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length);
          }
          if ((QPDFObjGen)local_228._0_8_ != QVar4) {
            operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
          }
          if (local_1f8 != pMVar12) {
            this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_78 = ((local_230->super_BaseHandle).obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og;
            QPDFObjGen::unparse_abi_cxx11_(&local_d8,&local_78,' ');
            std::operator+(&local_70,"stream data provider for ",&local_d8);
            plVar17 = (long *)std::__cxx11::string::append((char *)&local_70);
            local_118._M_dataplus._M_p = (pointer)*plVar17;
            psVar18 = (size_type *)(plVar17 + 2);
            if ((size_type *)local_118._M_dataplus._M_p == psVar18) {
              local_118.field_2._M_allocated_capacity = *psVar18;
              local_118.field_2._8_8_ = plVar17[3];
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            }
            else {
              local_118.field_2._M_allocated_capacity = *psVar18;
            }
            local_118._M_string_length = plVar17[1];
            *plVar17 = (long)psVar18;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            std::__cxx11::to_string(&local_98,(longlong)local_1f8);
            std::operator+(&local_50,&local_118,&local_98);
            plVar17 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_f8._M_dataplus._M_p = (pointer)*plVar17;
            psVar18 = (size_type *)(plVar17 + 2);
            if ((size_type *)local_f8._M_dataplus._M_p == psVar18) {
              local_f8.field_2._M_allocated_capacity = *psVar18;
              local_f8.field_2._8_8_ = plVar17[3];
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            }
            else {
              local_f8.field_2._M_allocated_capacity = *psVar18;
            }
            local_f8._M_string_length = plVar17[1];
            *plVar17 = (long)psVar18;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            std::__cxx11::to_string(&local_b8,(longlong)pMVar12);
            std::operator+(&local_1a8,&local_f8,&local_b8);
            plVar17 = (long *)std::__cxx11::string::append((char *)&local_1a8);
            local_228._0_8_ = *plVar17;
            pCVar19 = (ContentNormalizer *)(plVar17 + 2);
            if ((ContentNormalizer *)local_228._0_8_ == pCVar19) {
              local_228._16_8_ = (pCVar19->super_TokenFilter)._vptr_TokenFilter;
              local_228._24_8_ = plVar17[3];
              local_228._0_8_ = (ContentNormalizer *)(local_228 + 0x10);
            }
            else {
              local_228._16_8_ = (pCVar19->super_TokenFilter)._vptr_TokenFilter;
            }
            local_228._8_8_ = plVar17[1];
            *plVar17 = (long)pCVar19;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            std::runtime_error::runtime_error(this_02,(string *)local_228);
            __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"/Length","");
          QPDFObjectHandle::newInteger((QPDFObjectHandle *)&local_1a8,(longlong)local_1f8);
          QPDFObjectHandle::replaceKey(key,(string *)local_228,(QPDFObjectHandle *)&local_1a8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length);
          }
          if ((QPDFObjGen)local_228._0_8_ != QVar4) {
            operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
          }
        }
      }
      Pl_Count::~Pl_Count(&count);
      goto LAB_001fdfc5;
    }
    local_23c = (uint)uVar24;
    peVar3 = (local_230->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    offset = peVar3->parsed_offset;
    if (offset == 0) {
      local_1f0 = uVar23;
      this_03 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_03,"pipeStreamData called for stream with no data");
      __cxa_throw(this_03,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    qpdf = peVar3->qpdf;
    QVar4 = peVar3->og;
    local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (pMVar12->stream_dict).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    sVar15 = pMVar12->length;
    local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (pMVar12->stream_dict).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_148.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_148.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    local_1f0 = uVar23;
    bVar8 = isRootMetadata(local_230);
    bVar8 = QPDF::Pipe::pipeStreamData
                      (qpdf,QVar4,offset,sVar15,&local_148,bVar8,pipeline_local,local_23c._0_1_,
                       will_retry);
    if (local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_148.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    cVar9 = '\x01';
    uVar24 = (ulong)local_23c;
    if (bVar8) goto LAB_001fdfc5;
    if (filterp != (bool *)0x0) {
      *filterp = false;
    }
    cVar9 = '\0';
  }
  else {
    local_1f0 = uVar23;
    puVar14 = Buffer::getBuffer(this_00);
    sVar15 = Buffer::getSize((pMVar12->stream_data).
                             super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    (*pPVar7->_vptr_Pipeline[2])(pPVar7,puVar14,sVar15);
    cVar9 = '\x01';
    (*pipeline_local->_vptr_Pipeline[3])();
LAB_001fdfc5:
    bVar22 = (byte)local_1f0;
    if (filterp != (bool *)0x0) {
      bVar22 = *filterp;
    }
    if ((local_1b0 != (ContentNormalizer *)0x0 && ((~bVar22 | (byte)uVar24) & 1) == 0) &&
       (bVar8 = ContentNormalizer::anyBadTokens(local_1b0), bVar8)) {
      psVar18 = &count.super_Pipeline.identifier._M_string_length;
      count.super_Pipeline._vptr_Pipeline = (_func_int **)psVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&count,"content normalization encountered bad tokens","");
      warn(local_230,(string *)&count);
      if (count.super_Pipeline._vptr_Pipeline != (_func_int **)psVar18) {
        operator_delete(count.super_Pipeline._vptr_Pipeline,
                        count.super_Pipeline.identifier._M_string_length + 1);
      }
      bVar8 = ContentNormalizer::lastTokenWasBad(local_1b0);
      if (bVar8) {
        count.super_Pipeline._vptr_Pipeline = (_func_int **)psVar18;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&count,
                   "normalized content ended with a bad token; you may be able to resolve this by coalescing content streams in combination with normalizing content. From the command line, specify --coalesce-contents"
                   ,"");
        warn(local_230,(string *)&count);
        if (count.super_Pipeline._vptr_Pipeline != (_func_int **)psVar18) {
          operator_delete(count.super_Pipeline._vptr_Pipeline,
                          count.super_Pipeline.identifier._M_string_length + 1);
        }
      }
      count.super_Pipeline._vptr_Pipeline = (_func_int **)psVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&count,
                 "Resulting stream data may be corrupted but is may still useful for manual inspection. For more information on this warning, search for content normalization in the manual."
                 ,"");
      warn(local_230,(string *)&count);
      if (count.super_Pipeline._vptr_Pipeline != (_func_int **)psVar18) {
        operator_delete(count.super_Pipeline._vptr_Pipeline,
                        count.super_Pipeline.identifier._M_string_length + 1);
      }
    }
  }
  if (local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (local_238 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238);
  }
  std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::~vector
            (&to_delete);
LAB_001fe11e:
  std::
  vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>::
  ~vector(&filters);
  return (bool)cVar9;
}

Assistant:

bool
Stream::pipeStreamData(
    Pipeline* pipeline,
    bool* filterp,
    int encode_flags,
    qpdf_stream_decode_level_e decode_level,
    bool suppress_warnings,
    bool will_retry)
{
    auto s = stream();
    std::vector<std::shared_ptr<QPDFStreamFilter>> filters;
    bool specialized_compression = false;
    bool lossy_compression = false;
    bool ignored;
    if (filterp == nullptr) {
        filterp = &ignored;
    }
    bool& filter = *filterp;
    filter = (!((encode_flags == 0) && (decode_level == qpdf_dl_none)));
    bool success = true;
    if (filter) {
        filter = filterable(filters, specialized_compression, lossy_compression);
        if ((decode_level < qpdf_dl_all) && lossy_compression) {
            filter = false;
        }
        if ((decode_level < qpdf_dl_specialized) && specialized_compression) {
            filter = false;
        }
        QTC::TC(
            "qpdf",
            "QPDF_Stream special filters",
            (!filter)                     ? 0
                : lossy_compression       ? 1
                : specialized_compression ? 2
                                          : 3);
    }

    if (pipeline == nullptr) {
        QTC::TC("qpdf", "QPDF_Stream pipeStreamData with null pipeline");
        // Return value is whether we can filter in this case.
        return filter;
    }

    // Construct the pipeline in reverse order. Force pipelines we create to be deleted when this
    // function finishes. Pipelines created by QPDFStreamFilter objects will be deleted by those
    // objects.
    std::vector<std::shared_ptr<Pipeline>> to_delete;

    std::shared_ptr<ContentNormalizer> normalizer;
    std::shared_ptr<Pipeline> new_pipeline;
    if (filter) {
        if (encode_flags & qpdf_ef_compress) {
            new_pipeline =
                std::make_shared<Pl_Flate>("compress stream", pipeline, Pl_Flate::a_deflate);
            to_delete.push_back(new_pipeline);
            pipeline = new_pipeline.get();
        }

        if (encode_flags & qpdf_ef_normalize) {
            normalizer = std::make_shared<ContentNormalizer>();
            new_pipeline =
                std::make_shared<Pl_QPDFTokenizer>("normalizer", normalizer.get(), pipeline);
            to_delete.push_back(new_pipeline);
            pipeline = new_pipeline.get();
        }

        for (auto iter = s->token_filters.rbegin(); iter != s->token_filters.rend(); ++iter) {
            new_pipeline =
                std::make_shared<Pl_QPDFTokenizer>("token filter", (*iter).get(), pipeline);
            to_delete.push_back(new_pipeline);
            pipeline = new_pipeline.get();
        }

        for (auto f_iter = filters.rbegin(); f_iter != filters.rend(); ++f_iter) {
            auto decode_pipeline = (*f_iter)->getDecodePipeline(pipeline);
            if (decode_pipeline) {
                pipeline = decode_pipeline;
            }
            auto* flate = dynamic_cast<Pl_Flate*>(pipeline);
            if (flate != nullptr) {
                flate->setWarnCallback([this](char const* msg, int code) { warn(msg); });
            }
        }
    }

    if (s->stream_data.get()) {
        QTC::TC("qpdf", "QPDF_Stream pipe replaced stream data");
        pipeline->write(s->stream_data->getBuffer(), s->stream_data->getSize());
        pipeline->finish();
    } else if (s->stream_provider.get()) {
        Pl_Count count("stream provider count", pipeline);
        if (s->stream_provider->supportsRetry()) {
            if (!s->stream_provider->provideStreamData(
                    obj->getObjGen(), &count, suppress_warnings, will_retry)) {
                filter = false;
                success = false;
            }
        } else {
            s->stream_provider->provideStreamData(obj->getObjGen(), &count);
        }
        qpdf_offset_t actual_length = count.getCount();
        qpdf_offset_t desired_length = 0;
        if (success && s->stream_dict.hasKey("/Length")) {
            desired_length = s->stream_dict.getKey("/Length").getIntValue();
            if (actual_length == desired_length) {
                QTC::TC("qpdf", "QPDF_Stream pipe use stream provider");
            } else {
                QTC::TC("qpdf", "QPDF_Stream provider length mismatch");
                // This would be caused by programmer error on the part of a library user, not by
                // invalid input data.
                throw std::runtime_error(
                    "stream data provider for " + obj->getObjGen().unparse(' ') + " provided " +
                    std::to_string(actual_length) + " bytes instead of expected " +
                    std::to_string(desired_length) + " bytes");
            }
        } else if (success) {
            QTC::TC("qpdf", "QPDF_Stream provider length not provided");
            s->stream_dict.replaceKey("/Length", QPDFObjectHandle::newInteger(actual_length));
        }
    } else if (obj->getParsedOffset() == 0) {
        QTC::TC("qpdf", "QPDF_Stream pipe no stream data");
        throw std::logic_error("pipeStreamData called for stream with no data");
    } else {
        QTC::TC("qpdf", "QPDF_Stream pipe original stream data");
        if (!QPDF::Pipe::pipeStreamData(
                obj->getQPDF(),
                obj->getObjGen(),
                obj->getParsedOffset(),
                s->length,
                s->stream_dict,
                isRootMetadata(),
                pipeline,
                suppress_warnings,
                will_retry)) {
            filter = false;
            success = false;
        }
    }

    if (filter && (!suppress_warnings) && normalizer.get() && normalizer->anyBadTokens()) {
        warn("content normalization encountered bad tokens");
        if (normalizer->lastTokenWasBad()) {
            QTC::TC("qpdf", "QPDF_Stream bad token at end during normalize");
            warn(
                "normalized content ended with a bad token; you may be able to resolve this by "
                "coalescing content streams in combination with normalizing content. From the "
                "command line, specify --coalesce-contents");
        }
        warn(
            "Resulting stream data may be corrupted but is may still useful for manual "
            "inspection. For more information on this warning, search for content normalization "
            "in the manual.");
    }

    return success;
}